

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_get_standard_channel_map
               (ma_standard_channel_map standardChannelMap,ma_uint32 channels,ma_channel *channelMap
               )

{
  char cVar1;
  ulong uVar2;
  
  if (standardChannelMap != ma_standard_channel_map_alsa) {
    switch(channels - 1) {
    case 0:
      goto switchD_00108706_caseD_0;
    case 1:
switchD_00108706_caseD_1:
      channelMap[0] = '\x02';
      channelMap[1] = '\x03';
      return;
    case 2:
switchD_00108706_caseD_2:
      channelMap[0] = '\x02';
      channelMap[1] = '\x03';
      channelMap[2] = '\x04';
      return;
    case 3:
      builtin_memcpy(channelMap,"\x02\x03\x04\n",4);
      return;
    case 4:
      builtin_memcpy(channelMap,"\x02\x03\x04\x06\a",5);
      return;
    case 5:
      builtin_memcpy(channelMap,"\x02\x03\x04\x05\v\f",6);
      return;
    case 6:
      builtin_memcpy(channelMap,"\x02\x03\x04\x05\n\v\f",7);
      return;
    default:
      builtin_memcpy(channelMap,"\x02\x03\x04\x05\x06\a\v\f",8);
      if (channels < 9) {
        return;
      }
      uVar2 = 0;
      do {
        if (uVar2 < 0x18) {
          cVar1 = (char)uVar2;
          channelMap[uVar2 + 8] = cVar1 + '\x14';
          channelMap[uVar2 + 9] = cVar1 + '\x15';
          channelMap[uVar2 + 10] = cVar1 + '\x16';
          channelMap[uVar2 + 0xb] = cVar1 + '\x17';
          channelMap[uVar2 + 0xc] = cVar1 + '\x18';
          channelMap[uVar2 + 0xd] = cVar1 + '\x19';
          channelMap[uVar2 + 0xe] = cVar1 + '\x1a';
          channelMap[uVar2 + 0xf] = cVar1 + '\x1b';
        }
        uVar2 = uVar2 + 8;
      } while (uVar2 != 0x18);
      return;
    }
  }
  switch(channels - 1) {
  case 0:
switchD_00108706_caseD_0:
    *channelMap = '\x01';
    return;
  case 1:
    goto switchD_00108706_caseD_1;
  case 2:
    goto switchD_00108706_caseD_2;
  case 3:
    builtin_memcpy(channelMap,"\x02\x03\x06\a",4);
    return;
  case 4:
    builtin_memcpy(channelMap,"\x02\x03\x06\a\x04",5);
    return;
  case 5:
    builtin_memcpy(channelMap,"\x02\x03\x06\a\x04\x05",6);
    return;
  case 6:
    builtin_memcpy(channelMap,"\x02\x03\x06\a\x04\x05\n",7);
    return;
  default:
    builtin_memcpy(channelMap,"\x02\x03\x06\a\x04\x05\v\f",8);
    if (8 < channels) {
      uVar2 = 0;
      do {
        if (uVar2 < 0x18) {
          cVar1 = (char)uVar2;
          channelMap[uVar2 + 8] = cVar1 + '\x14';
          channelMap[uVar2 + 9] = cVar1 + '\x15';
          channelMap[uVar2 + 10] = cVar1 + '\x16';
          channelMap[uVar2 + 0xb] = cVar1 + '\x17';
          channelMap[uVar2 + 0xc] = cVar1 + '\x18';
          channelMap[uVar2 + 0xd] = cVar1 + '\x19';
          channelMap[uVar2 + 0xe] = cVar1 + '\x1a';
          channelMap[uVar2 + 0xf] = cVar1 + '\x1b';
        }
        uVar2 = uVar2 + 8;
      } while (uVar2 != 0x18);
    }
    return;
  }
}

Assistant:

static void ma_get_standard_channel_map_microsoft(ma_uint32 channels, ma_channel channelMap[MA_MAX_CHANNELS])
{
    /* Based off the speaker configurations mentioned here: https://docs.microsoft.com/en-us/windows-hardware/drivers/ddi/content/ksmedia/ns-ksmedia-ksaudio_channel_config */
    switch (channels)
    {
        case 1:
        {
            channelMap[0] = MA_CHANNEL_MONO;
        } break;

        case 2:
        {
            channelMap[0] = MA_CHANNEL_FRONT_LEFT;
            channelMap[1] = MA_CHANNEL_FRONT_RIGHT;
        } break;

        case 3: /* Not defined, but best guess. */
        {
            channelMap[0] = MA_CHANNEL_FRONT_LEFT;
            channelMap[1] = MA_CHANNEL_FRONT_RIGHT;
            channelMap[2] = MA_CHANNEL_FRONT_CENTER;
        } break;

        case 4:
        {
#ifndef MA_USE_QUAD_MICROSOFT_CHANNEL_MAP
            /* Surround. Using the Surround profile has the advantage of the 3rd channel (MA_CHANNEL_FRONT_CENTER) mapping nicely with higher channel counts. */
            channelMap[0] = MA_CHANNEL_FRONT_LEFT;
            channelMap[1] = MA_CHANNEL_FRONT_RIGHT;
            channelMap[2] = MA_CHANNEL_FRONT_CENTER;
            channelMap[3] = MA_CHANNEL_BACK_CENTER;
#else
            /* Quad. */
            channelMap[0] = MA_CHANNEL_FRONT_LEFT;
            channelMap[1] = MA_CHANNEL_FRONT_RIGHT;
            channelMap[2] = MA_CHANNEL_BACK_LEFT;
            channelMap[3] = MA_CHANNEL_BACK_RIGHT;
#endif
        } break;

        case 5: /* Not defined, but best guess. */
        {
            channelMap[0] = MA_CHANNEL_FRONT_LEFT;
            channelMap[1] = MA_CHANNEL_FRONT_RIGHT;
            channelMap[2] = MA_CHANNEL_FRONT_CENTER;
            channelMap[3] = MA_CHANNEL_BACK_LEFT;
            channelMap[4] = MA_CHANNEL_BACK_RIGHT;
        } break;

        case 6:
        {
            channelMap[0] = MA_CHANNEL_FRONT_LEFT;
            channelMap[1] = MA_CHANNEL_FRONT_RIGHT;
            channelMap[2] = MA_CHANNEL_FRONT_CENTER;
            channelMap[3] = MA_CHANNEL_LFE;
            channelMap[4] = MA_CHANNEL_SIDE_LEFT;
            channelMap[5] = MA_CHANNEL_SIDE_RIGHT;
        } break;

        case 7: /* Not defined, but best guess. */
        {
            channelMap[0] = MA_CHANNEL_FRONT_LEFT;
            channelMap[1] = MA_CHANNEL_FRONT_RIGHT;
            channelMap[2] = MA_CHANNEL_FRONT_CENTER;
            channelMap[3] = MA_CHANNEL_LFE;
            channelMap[4] = MA_CHANNEL_BACK_CENTER;
            channelMap[5] = MA_CHANNEL_SIDE_LEFT;
            channelMap[6] = MA_CHANNEL_SIDE_RIGHT;
        } break;

        case 8:
        default:
        {
            channelMap[0] = MA_CHANNEL_FRONT_LEFT;
            channelMap[1] = MA_CHANNEL_FRONT_RIGHT;
            channelMap[2] = MA_CHANNEL_FRONT_CENTER;
            channelMap[3] = MA_CHANNEL_LFE;
            channelMap[4] = MA_CHANNEL_BACK_LEFT;
            channelMap[5] = MA_CHANNEL_BACK_RIGHT;
            channelMap[6] = MA_CHANNEL_SIDE_LEFT;
            channelMap[7] = MA_CHANNEL_SIDE_RIGHT;
        } break;
    }

    /* Remainder. */
    if (channels > 8) {
        ma_uint32 iChannel;
        for (iChannel = 8; iChannel < MA_MAX_CHANNELS; ++iChannel) {
            channelMap[iChannel] = (ma_channel)(MA_CHANNEL_AUX_0 + (iChannel-8));
        }
    }
}